

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::makeMemberDebugType(Builder *this,Id memberType,DebugTypeLoc *debugTypeLoc)

{
  uint uVar1;
  iterator __position;
  Id IVar2;
  mapped_type_conflict *pmVar3;
  Instruction *this_00;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_01;
  Id IVar4;
  Instruction *type;
  Instruction *local_40;
  Id local_34;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  
  local_34 = memberType;
  pmVar3 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->debugId,&local_34);
  if (*pmVar3 != 0) {
    this_00 = (Instruction *)operator_new(0x60);
    IVar4 = this->uniqueId + 1;
    this->uniqueId = IVar4;
    IVar2 = makeVoidType(this);
    this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
    this_00->resultId = IVar4;
    this_00->typeId = IVar2;
    this_00->opCode = OpExtInst;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
    this_00->block = (Block *)0x0;
    local_40 = this_00;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this_00->operands,10);
    if ((ulong)(((long)(this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage -
                (long)(this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) < 10) {
      std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&this_00->idOperand,10);
    }
    Instruction::addIdOperand(this_00,this->nonSemanticShaderDebugInfo);
    Instruction::addImmediateOperand(this_00,0xb);
    IVar2 = getStringId(this,&debugTypeLoc->name);
    Instruction::addIdOperand(this_00,IVar2);
    pmVar3 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&local_34);
    Instruction::addIdOperand(this_00,*pmVar3);
    IVar2 = makeDebugSource(this,this->currentFileId);
    Instruction::addIdOperand(this_00,IVar2);
    uVar1 = debugTypeLoc->line;
    IVar2 = makeIntegerType(this,0x20,false);
    IVar2 = makeIntConstant(this,IVar2,uVar1,false);
    Instruction::addIdOperand(this_00,IVar2);
    uVar1 = debugTypeLoc->column;
    IVar2 = makeIntegerType(this,0x20,false);
    IVar2 = makeIntConstant(this,IVar2,uVar1,false);
    Instruction::addIdOperand(this_00,IVar2);
    IVar2 = makeIntegerType(this,0x20,false);
    IVar2 = makeIntConstant(this,IVar2,0,false);
    Instruction::addIdOperand(this_00,IVar2);
    IVar2 = makeIntegerType(this,0x20,false);
    IVar2 = makeIntConstant(this,IVar2,0,false);
    Instruction::addIdOperand(this_00,IVar2);
    IVar2 = makeIntegerType(this,0x20,false);
    IVar2 = makeIntConstant(this,IVar2,3,false);
    Instruction::addIdOperand(this_00,IVar2);
    local_30._M_head_impl._0_4_ = 0xb;
    this_01 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
              std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->groupedDebugTypes,(key_type *)&local_30);
    __position._M_current = *(Instruction ***)(this_01 + 8);
    if (__position._M_current == *(Instruction ***)(this_01 + 0x10)) {
      std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
      _M_realloc_insert<spv::Instruction*const&>(this_01,__position,&local_40);
      local_30._M_head_impl = local_40;
    }
    else {
      *__position._M_current = this_00;
      *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
      local_30._M_head_impl = this_00;
    }
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
    if (local_30._M_head_impl != (Instruction *)0x0) {
      (*(local_30._M_head_impl)->_vptr_Instruction[1])();
    }
    Module::mapInstruction(&this->module,local_40);
    return local_40->resultId;
  }
  __assert_fail("debugId[memberType] != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x3fa,"Id spv::Builder::makeMemberDebugType(const Id, const DebugTypeLoc &)");
}

Assistant:

Id Builder::makeMemberDebugType(Id const memberType, DebugTypeLoc const& debugTypeLoc)
{
    assert(debugId[memberType] != 0);

    Instruction* type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(10);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeMember);
    type->addIdOperand(getStringId(debugTypeLoc.name)); // name id
    type->addIdOperand(debugId[memberType]); // type id
    type->addIdOperand(makeDebugSource(currentFileId)); // source id
    type->addIdOperand(makeUintConstant(debugTypeLoc.line)); // line id TODO: currentLine is always zero
    type->addIdOperand(makeUintConstant(debugTypeLoc.column)); // TODO: column id
    type->addIdOperand(makeUintConstant(0)); // TODO: offset id
    type->addIdOperand(makeUintConstant(0)); // TODO: size id
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsPublic)); // flags id

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeMember].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}